

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_reader.cpp
# Opt level: O0

size_t __thiscall ximu::PacketReader::PacketSize(PacketReader *this,PacketHeaders header)

{
  PacketHeaders header_local;
  PacketReader *this_local;
  
  if (header == CAL_INERTIAL_AND_MAGNETIC_DATA) {
    this_local = (PacketReader *)0x14;
  }
  else if (header == QUATERNION_DATA) {
    this_local = (PacketReader *)0xa;
  }
  else {
    this_local = (PacketReader *)0x0;
  }
  return (size_t)this_local;
}

Assistant:

size_t PacketReader::PacketSize(ximu::PacketHeaders header) {
  switch (header) {
    case ximu::PacketHeaders::QUATERNION_DATA:
      return 10;
    case ximu::PacketHeaders::CAL_INERTIAL_AND_MAGNETIC_DATA:
      return 20;
    }

  return 0;
}